

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_functions.hpp
# Opt level: O1

double inefficiency_cost(Vehicle vehicle,Full_Trajectory trajectory,Predictions predictions,
                        TrajectoryData data)

{
  long in_RDI;
  double dVar1;
  
  dVar1 = (double)(float)(*(double *)(in_RDI + 0x38) - (double)vehicle._8_8_) /
          *(double *)(in_RDI + 0x38);
  return dVar1 * dVar1 * 100.0;
}

Assistant:

double inefficiency_cost(Vehicle vehicle, Full_Trajectory trajectory, Predictions predictions, TrajectoryData data)
{
        double speed = data.avg_speed;
        double target_speed = vehicle.m_target_speed;
        double diff = target_speed - speed;
        double pct = float(diff) / target_speed;
        double multiplier = std::pow(pct,2.0);
        return multiplier * EFFICIENCY;
}